

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-inventory.c
# Opt level: O2

void borg_cheat_inven(void)

{
  object *obj;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  char buf [256];
  
  lVar4 = 0;
  uVar5 = 0;
  do {
    if (z_info->pack_size <= uVar5) {
      return;
    }
    obj = player->upkeep->inven[uVar5];
    memset(borg_items->desc + lVar4,0,0x388);
    if ((obj != (object *)0x0) && (obj->kind != (object_kind *)0x0)) {
      buf[0] = '\0';
      object_desc(buf,0x100,obj,3,player);
      iVar1 = bcmp(buf,"(nothing)",10);
      if (iVar1 != 0) {
        borg_item_analyze((borg_item_conflict *)(borg_items->desc + lVar4),obj,buf,false);
        borg_do_crush_junk = true;
        pcVar3 = borg_items->desc;
        pcVar2 = strchr(pcVar3 + lVar4,0x21);
        if (pcVar2 == (char *)0x0) {
          pcVar3 = strstr(pcVar3 + lVar4,"borg");
          if (pcVar3 == (char *)0x0) goto LAB_00215295;
        }
        borg_deinscribe((int)uVar5);
      }
    }
LAB_00215295:
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x388;
  } while( true );
}

Assistant:

void borg_cheat_inven(void)
{
    int i;

    char buf[256];

    /* Extract the inventory */
    for (i = 0; i < z_info->pack_size; i++) {
        struct object *obj = player->upkeep->inven[i];
        memset(&borg_items[i], 0, sizeof(borg_item));

        /* Skip non-items */
        if (!obj || !obj->kind)
            continue;

        /* Default to "nothing" */
        buf[0] = '\0';

        /* Describe it */
        object_desc(buf, sizeof(buf), obj, ODESC_FULL, player);

        /* Skip Empty slots */
        if (streq(buf, "(nothing)"))
            continue;

        /* Analyze the item (no price) */
        borg_item_analyze(&borg_items[i], obj, buf, false);

        /* Note changed inventory */
        borg_do_crush_junk = true;

        /* Uninscribe items with ! or borg inscriptions */
        if (strstr(borg_items[i].desc, "!") || strstr(borg_items[i].desc, "borg"))
            borg_deinscribe(i);
    }
}